

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cVertexAttribBindingTests.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::NegativeVertexAttribBinding::Run(NegativeVertexAttribBinding *this)

{
  GLenum GVar1;
  int local_1c;
  NegativeVertexAttribBinding *pNStack_18;
  GLint p;
  NegativeVertexAttribBinding *this_local;
  
  pNStack_18 = this;
  glu::CallLogWrapper::glBindVertexArray
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_vao);
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8869,&local_1c);
  glu::CallLogWrapper::glVertexAttribBinding
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,local_1c + 1,0);
  GVar1 = glu::CallLogWrapper::glGetError
                    (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper);
  if (GVar1 == 0x501) {
    glu::CallLogWrapper::glGetIntegerv
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x82da,&local_1c);
    glu::CallLogWrapper::glVertexAttribBinding
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0,local_1c + 1);
    GVar1 = glu::CallLogWrapper::glGetError
                      (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper);
    if (GVar1 == 0x501) {
      glu::CallLogWrapper::glBindVertexArray
                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0);
      glu::CallLogWrapper::glVertexAttribBinding
                (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0,0);
      GVar1 = glu::CallLogWrapper::glGetError
                        (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                          super_CallLogWrapper);
      if (GVar1 == 0x502) {
        this_local = (NegativeVertexAttribBinding *)0x0;
      }
      else {
        anon_unknown_0::Output("INVALID_OPERATION should be generated (default VAO).\n");
        this_local = (NegativeVertexAttribBinding *)&DAT_ffffffffffffffff;
      }
    }
    else {
      anon_unknown_0::Output
                (
                "INVALID_VALUE should be generated (bindingIndex greater than GL_MAX_VERTEX_ATTRIB_BINDINGS).\n"
                );
      this_local = (NegativeVertexAttribBinding *)&DAT_ffffffffffffffff;
    }
  }
  else {
    anon_unknown_0::Output
              (
              "INVALID_VALUE should be generated (attribindex greater than GL_MAX_VERTEX_ATTRIBS).\n"
              );
    this_local = (NegativeVertexAttribBinding *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		/*
		 Errors
		 An INVALID_VALUE error is generated if attribindex is greater than or
		 equal to the value of MAX_VERTEX_ATTRIBS.
		 An INVALID_VALUE error is generated if bindingindex is greater than or
		 equal to the value of MAX_VERTEX_ATTRIB_BINDINGS.
		 An INVALID_OPERATION error is generated if no vertex array object is
		 bound.
		 */
		glBindVertexArray(m_vao);
		GLint p;
		glGetIntegerv(GL_MAX_VERTEX_ATTRIBS, &p);
		glVertexAttribBinding(p + 1, 0);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE should be generated (attribindex greater than GL_MAX_VERTEX_ATTRIBS).\n");
			return ERROR;
		}
		glGetIntegerv(GL_MAX_VERTEX_ATTRIB_BINDINGS, &p);
		glVertexAttribBinding(0, p + 1);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE should be generated (bindingIndex greater than GL_MAX_VERTEX_ATTRIB_BINDINGS).\n");
			return ERROR;
		}
		glBindVertexArray(0);
		glVertexAttribBinding(0, 0);
		if (glGetError() != GL_INVALID_OPERATION)
		{
			Output("INVALID_OPERATION should be generated (default VAO).\n");
			return ERROR;
		}
		return NO_ERROR;
	}